

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

baseHolder * __thiscall cs_impl::any::holder<int>::duplicate(holder<int> *this)

{
  baseHolder *pbVar1;
  
  if ((DAT_0025cf48 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar1 = *(baseHolder **)
              (&holder<cs_impl::path_cs_ext::path_info>::allocator + DAT_0025cf48 * 8);
    DAT_0025cf48 = DAT_0025cf48 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_00254080;
  *(int *)&pbVar1[1]._vptr_baseHolder = this->mDat;
  return pbVar1;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}